

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode AcceptServerConnect(connectdata *conn)

{
  SessionHandle *data;
  curl_sockopt_callback p_Var1;
  int iVar2;
  int sockfd;
  int iVar3;
  CURLcode CVar4;
  curl_socklen_t size;
  sockaddr_in add;
  socklen_t local_34;
  sockaddr local_30;
  
  data = conn->data;
  iVar3 = conn->sock[1];
  local_34 = 0x10;
  iVar2 = getsockname(iVar3,&local_30,&local_34);
  sockfd = -1;
  if (iVar2 == 0) {
    local_34 = 0x10;
    sockfd = accept(iVar3,&local_30,&local_34);
  }
  Curl_closesocket(conn,iVar3);
  if (sockfd == -1) {
    Curl_failf(data,"Error accept()ing server connect");
    CVar4 = CURLE_FTP_PORT_FAILED;
  }
  else {
    CVar4 = CURLE_OK;
    Curl_infof(data,"Connection accepted from server\n");
    conn->sock[1] = sockfd;
    curlx_nonblock(sockfd,1);
    conn->sock_accepted[1] = true;
    p_Var1 = (data->set).fsockopt;
    if (p_Var1 != (curl_sockopt_callback)0x0) {
      iVar3 = (*p_Var1)((data->set).sockopt_client,sockfd,CURLSOCKTYPE_ACCEPT);
      if (iVar3 != 0) {
        Curl_closesocket(conn,sockfd);
        conn->sock[1] = -1;
        CVar4 = CURLE_ABORTED_BY_CALLBACK;
      }
    }
  }
  return CVar4;
}

Assistant:

static CURLcode AcceptServerConnect(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;
  curl_socket_t sock = conn->sock[SECONDARYSOCKET];
  curl_socket_t s = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
  struct Curl_sockaddr_storage add;
#else
  struct sockaddr_in add;
#endif
  curl_socklen_t size = (curl_socklen_t) sizeof(add);

  if(0 == getsockname(sock, (struct sockaddr *) &add, &size)) {
    size = sizeof(add);

    s=accept(sock, (struct sockaddr *) &add, &size);
  }
  Curl_closesocket(conn, sock); /* close the first socket */

  if(CURL_SOCKET_BAD == s) {
    failf(data, "Error accept()ing server connect");
    return CURLE_FTP_PORT_FAILED;
  }
  infof(data, "Connection accepted from server\n");

  conn->sock[SECONDARYSOCKET] = s;
  (void)curlx_nonblock(s, TRUE); /* enable non-blocking */
  conn->sock_accepted[SECONDARYSOCKET] = TRUE;

  if(data->set.fsockopt) {
    int error = 0;

    /* activate callback for setting socket options */
    error = data->set.fsockopt(data->set.sockopt_client,
                               s,
                               CURLSOCKTYPE_ACCEPT);

    if(error) {
      Curl_closesocket(conn, s); /* close the socket and bail out */
      conn->sock[SECONDARYSOCKET] = CURL_SOCKET_BAD;
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  return CURLE_OK;

}